

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ics_impl.cpp
# Opt level: O3

void __thiscall ui::anon_unknown_0::ICSImpl::StoreConfig(ICSImpl *this)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  time_t time_;
  ofstream config_file;
  undefined1 auStack_238 [8];
  long *local_230 [2];
  long local_220 [2];
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  (anonymous_namespace)::BeagleConfigPath_abi_cxx11_();
  std::ofstream::ofstream(&local_210,(string *)local_230,_S_out);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 5) == 0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    local_230[0] = (long *)(lVar1 / 1000000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"# Last Updated : ",0x11);
    __s = ctime((time_t *)local_230);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_210 + -0x18) + 0x28);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"gateway=",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,(this->gateway_str)._M_dataplus._M_p,
                        (this->gateway_str)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"dns1=",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,(this->dns_1_str)._M_dataplus._M_p,
                        (this->dns_1_str)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"dns2=",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,(this->dns_2_str)._M_dataplus._M_p,
                        (this->dns_2_str)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _execvp;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void StoreConfig() {
    std::ofstream config_file(BeagleConfigPath());
    if (!config_file) {
      return;
    }

    // Updating the current configuration and adding timestamp
    std::time_t time_ =
        std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

    config_file << "# Last Updated : " << std::ctime(&time_);
    config_file << "gateway=" << gateway_str << std::endl;
    config_file << "dns1=" << dns_1_str << std::endl;
    config_file << "dns2=" << dns_2_str << std::endl;
  }